

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int main(int argc,char **argv)

{
  code *pcVar1;
  int iVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_3e8;
  size_t local_3e0;
  undefined1 local_3d8 [8];
  ptls_context_t minicrypto_ctx;
  undefined1 local_300 [8];
  ptls_iovec_t minicrypto_certificate;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
  undefined4 uStack_2bc;
  long local_2b8;
  size_t i_5;
  undefined4 uStack_2a4;
  long local_2a0;
  size_t i_4;
  undefined4 uStack_28c;
  long local_288;
  size_t i_3;
  undefined4 uStack_274;
  long local_270;
  size_t i_2;
  undefined4 uStack_25c;
  long local_258;
  size_t i_1;
  undefined4 uStack_244;
  long local_240;
  size_t i;
  ptls_key_exchange_context_t *esni_private_keys [2];
  ptls_context_t openssl_ctx_sha256only;
  ptls_context_t openssl_ctx;
  X509_STORE *cert_store;
  ptls_iovec_t cert;
  undefined1 local_78 [4];
  int opt;
  ptls_openssl_verify_certificate_t openssl_verify_certificate;
  ptls_openssl_sign_certificate_t openssl_sign_certificate;
  char **argv_local;
  int argc_local;
  
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  if (argc < 2) {
    subtest("bf",test_bf);
    subtest("key-exchange",test_key_exchanges);
    setup_certificate((ptls_iovec_t *)&cert_store);
    setup_sign_certificate
              ((ptls_openssl_sign_certificate_t *)&openssl_verify_certificate.cert_store);
    openssl_ctx.private_key_method = (ptls_private_key_method_t *)X509_STORE_new();
    X509_STORE_set_verify_cb((X509_STORE *)openssl_ctx.private_key_method,verify_cert_cb);
    ptls_openssl_init_verify_certificate
              ((ptls_openssl_verify_certificate_t *)local_78,
               (X509_STORE *)openssl_ctx.private_key_method);
    openssl_ctx_sha256only.private_key_method =
         (ptls_private_key_method_t *)ptls_openssl_random_bytes;
    openssl_ctx.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
    openssl_ctx.get_time = (ptls_get_time_t *)ptls_openssl_key_exchanges;
    openssl_ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_openssl_cipher_suites;
    openssl_ctx.cipher_suites = (ptls_cipher_suite_t **)&cert_store;
    openssl_ctx.certificates.list = (ptls_iovec_t *)0x1;
    openssl_ctx.certificates.count = 0;
    openssl_ctx.esni = (ptls_esni_context_t **)0x0;
    openssl_ctx.on_client_hello = (ptls_on_client_hello_t *)0x0;
    openssl_ctx.emit_certificate = (ptls_emit_certificate_t *)&openssl_verify_certificate.cert_store
    ;
    openssl_ctx.sign_certificate = (ptls_sign_certificate_t *)0x0;
    openssl_ctx.verify_certificate._0_4_ = 0;
    openssl_ctx.verify_certificate._4_4_ = 0;
    openssl_ctx.ticket_lifetime = 0;
    openssl_ctx.max_early_data_size = 0;
    openssl_ctx.hkdf_label_prefix__obsolete._0_1_ =
         (byte)openssl_ctx.hkdf_label_prefix__obsolete & 0xe0;
    openssl_ctx._104_8_ = 0;
    openssl_ctx.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
    openssl_ctx.save_ticket = (ptls_save_ticket_t *)0x0;
    openssl_ctx.log_event = (ptls_log_event_t *)0x0;
    openssl_ctx.update_open_count = (ptls_update_open_count_t *)0x0;
    openssl_ctx.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
    openssl_ctx.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
    memset(&openssl_ctx.update_esni_key,0,0x10);
    openssl_ctx.pkey_buf.len = 0;
    openssl_ctx.on_extension = (ptls_on_extension_t *)0x0;
    if (*(long *)((*openssl_ctx.key_exchanges)->exchange + 8) != 0x30) {
      __assert_fail("openssl_ctx.cipher_suites[0]->hash->digest_size == 48",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                    ,0x171,"int main(int, char **)");
    }
    memcpy(esni_private_keys + 1,&openssl_ctx_sha256only.private_key_method,200);
    openssl_ctx_sha256only.key_exchanges = openssl_ctx_sha256only.key_exchanges + 1;
    if (*(long *)((*openssl_ctx_sha256only.key_exchanges)->exchange + 8) != 0x20) {
      __assert_fail("openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c"
                    ,0x174,"int main(int, char **)");
    }
    i = (size_t)key_from_pem(
                            "-----BEGIN EC PARAMETERS-----\nBggqhkjOPQMBBw==\n-----END EC PARAMETERS-----\n-----BEGIN EC PRIVATE KEY-----\nMHcCAQEEIGrRVTfTXuOVewLt/g+Ugvg9XW/g4lGXrkZ8fdYaYuJCoAoGCCqGSM49\nAwEHoUQDQgAEPu73EON1B6j7PvxiUCSVoGFu/2tjD6P9zDM20LEtVbqwBr20KYLG\n2e5mhKljlES+BOfuz6vCyd1A5siJiO2Uhg==\n-----END EC PRIVATE KEY-----\n"
                            );
    esni_private_keys[0] = (ptls_key_exchange_context_t *)0x0;
    ctx_peer = (ptls_context_t *)&openssl_ctx_sha256only.private_key_method;
    ctx = (ptls_context_t *)&openssl_ctx_sha256only.private_key_method;
    verify_certificate = (ptls_verify_certificate_t *)local_78;
    for (local_240 = 0; ffx_variants[local_240].algo != (ptls_cipher_algorithm_t *)0x0;
        local_240 = local_240 + 1) {
    }
    ffx_variants[local_240].algo = &ptls_ffx_ptls_openssl_aes128ctr_b125_r8;
    *(ulong *)&ffx_variants[local_240].bit_length = CONCAT44(uStack_244,0x7d);
    for (local_258 = 0; ffx_variants[local_258].algo != (ptls_cipher_algorithm_t *)0x0;
        local_258 = local_258 + 1) {
    }
    ffx_variants[local_258].algo = &ptls_ffx_ptls_openssl_aes128ctr_b31_r6;
    *(ulong *)&ffx_variants[local_258].bit_length = CONCAT44(uStack_25c,0x1f);
    for (local_270 = 0; ffx_variants[local_270].algo != (ptls_cipher_algorithm_t *)0x0;
        local_270 = local_270 + 1) {
    }
    ffx_variants[local_270].algo = &ptls_ffx_ptls_openssl_aes128ctr_b53_r4;
    *(ulong *)&ffx_variants[local_270].bit_length = CONCAT44(uStack_274,0x35);
    for (local_288 = 0; ffx_variants[local_288].algo != (ptls_cipher_algorithm_t *)0x0;
        local_288 = local_288 + 1) {
    }
    ffx_variants[local_288].algo = &ptls_ffx_ptls_openssl_chacha20_b256_r8;
    *(ulong *)&ffx_variants[local_288].bit_length = CONCAT44(uStack_28c,0x100);
    for (local_2a0 = 0; ffx_variants[local_2a0].algo != (ptls_cipher_algorithm_t *)0x0;
        local_2a0 = local_2a0 + 1) {
    }
    ffx_variants[local_2a0].algo = &ptls_ffx_ptls_openssl_chacha20_b32_r6;
    *(ulong *)&ffx_variants[local_2a0].bit_length = CONCAT44(uStack_2a4,0x20);
    for (local_2b8 = 0; ffx_variants[local_2b8].algo != (ptls_cipher_algorithm_t *)0x0;
        local_2b8 = local_2b8 + 1) {
    }
    ffx_variants[local_2b8].algo = &ptls_ffx_ptls_openssl_chacha20_b57_r4;
    *(ulong *)&ffx_variants[local_2b8].bit_length = CONCAT44(uStack_2bc,0x39);
    subtest("rsa-sign",test_rsa_sign);
    subtest("ecdsa-sign",test_ecdsa_sign);
    subtest("cert-verify",test_cert_verify);
    subtest("picotls",test_picotls);
    test_picotls_esni((ptls_key_exchange_context_t **)&i);
    ctx_peer = (ptls_context_t *)(esni_private_keys + 1);
    ctx = (ptls_context_t *)(esni_private_keys + 1);
    subtest("picotls",test_picotls);
    ctx = (ptls_context_t *)(esni_private_keys + 1);
    ctx_peer = (ptls_context_t *)&openssl_ctx_sha256only.private_key_method;
    subtest("picotls",test_picotls);
    ctx = (ptls_context_t *)&openssl_ctx_sha256only.private_key_method;
    ctx_peer = (ptls_context_t *)(esni_private_keys + 1);
    subtest("picotls",test_picotls);
    _local_300 = ptls_iovec_init(anon_var_dwarf_14872,0x264);
    join_0x00000010_0x00000000_ = ptls_iovec_init(anon_var_dwarf_1488a,0x20);
    ptls_minicrypto_init_secp256r1sha256_sign_certificate
              ((ptls_minicrypto_secp256r1sha256_sign_certificate_t *)&minicrypto_certificate.len,
               join_0x00000010_0x00000000_);
    local_3d8 = (undefined1  [8])ptls_minicrypto_random_bytes;
    minicrypto_ctx.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
    minicrypto_ctx.get_time = (ptls_get_time_t *)ptls_minicrypto_key_exchanges;
    minicrypto_ctx.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_minicrypto_cipher_suites;
    minicrypto_ctx.cipher_suites = (ptls_cipher_suite_t **)local_300;
    minicrypto_ctx.certificates.list = (ptls_iovec_t *)0x1;
    minicrypto_ctx.certificates.count = 0;
    minicrypto_ctx.esni = (ptls_esni_context_t **)0x0;
    minicrypto_ctx.on_client_hello = (ptls_on_client_hello_t *)0x0;
    minicrypto_ctx.emit_certificate = (ptls_emit_certificate_t *)&minicrypto_certificate.len;
    minicrypto_ctx.sign_certificate = (ptls_sign_certificate_t *)0x0;
    minicrypto_ctx.verify_certificate._0_4_ = 0;
    minicrypto_ctx.verify_certificate._4_4_ = 0;
    minicrypto_ctx.ticket_lifetime = 0;
    minicrypto_ctx.max_early_data_size = 0;
    minicrypto_ctx.hkdf_label_prefix__obsolete._0_1_ =
         (byte)minicrypto_ctx.hkdf_label_prefix__obsolete & 0xe0;
    minicrypto_ctx._104_8_ = 0;
    minicrypto_ctx.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
    minicrypto_ctx.save_ticket = (ptls_save_ticket_t *)0x0;
    minicrypto_ctx.log_event = (ptls_log_event_t *)0x0;
    minicrypto_ctx.update_open_count = (ptls_update_open_count_t *)0x0;
    minicrypto_ctx.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
    minicrypto_ctx.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
    memset(&minicrypto_ctx.update_esni_key,0,0x10);
    minicrypto_ctx.pkey_buf.len = 0;
    minicrypto_ctx.on_extension = (ptls_on_extension_t *)0x0;
    ctx = (ptls_context_t *)&openssl_ctx_sha256only.private_key_method;
    ctx_peer = (ptls_context_t *)local_3d8;
    subtest("vs. minicrypto",test_picotls);
    ctx = (ptls_context_t *)local_3d8;
    ctx_peer = (ptls_context_t *)&openssl_ctx_sha256only.private_key_method;
    subtest("minicrypto vs.",test_picotls);
    pcVar1 = *(code **)(i + 0x18);
    pVar3 = ptls_iovec_init((void *)0x0,0);
    local_3e8 = pVar3.base;
    local_3e0 = pVar3.len;
    (*pcVar1)(&i,1,0,local_3e8,local_3e0);
    argv_local._4_4_ = done_testing();
  }
  else {
    while (cert.len._4_4_ = getopt(argc,argv,"s"), cert.len._4_4_ != -1) {
      if (cert.len._4_4_ == 0x73) {
        printf("Sign certificate\n");
        iVar2 = sign_only();
        return iVar2;
      }
      printf("Usage: test-openssl.t [-s]\n");
      printf("   no parameters runs ALL tests\n");
      printf("   -s is a sign test where we test a single handshake with logging\n");
    }
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t openssl_sign_certificate;
    ptls_openssl_verify_certificate_t openssl_verify_certificate;

    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

#ifdef OPTS
    if (argc > 1)
    {
        int opt;
        while ((opt = getopt(argc, argv, "s")) != -1)
        {
            switch (opt)
            {
                case 's':
                    printf("Sign certificate\n");
                    return sign_only();
                default:
                    printf("Usage: test-openssl.t [-s]\n");
                    printf("   no parameters runs ALL tests\n");
                    printf("   -s is a sign test where we test a single handshake with logging\n");
                    break;
            }
        }
        return 1;
    }
#endif

    subtest("bf", test_bf);

    subtest("key-exchange", test_key_exchanges);

    ptls_iovec_t cert;
    setup_certificate(&cert);
    setup_sign_certificate(&openssl_sign_certificate);
    X509_STORE *cert_store = X509_STORE_new();
    X509_STORE_set_verify_cb(cert_store, verify_cert_cb);
    ptls_openssl_init_verify_certificate(&openssl_verify_certificate, cert_store);
    /* we should call X509_STORE_free on OpenSSL 1.1 or in prior versions decrement refount then call _free */
    ptls_context_t openssl_ctx = {ptls_openssl_random_bytes,
                                  &ptls_get_time,
                                  ptls_openssl_key_exchanges,
                                  ptls_openssl_cipher_suites,
                                  {&cert, 1},
                                  NULL,
                                  NULL,
                                  NULL,
                                  &openssl_sign_certificate.super};
    assert(openssl_ctx.cipher_suites[0]->hash->digest_size == 48); /* sha384 */
    ptls_context_t openssl_ctx_sha256only = openssl_ctx;
    ++openssl_ctx_sha256only.cipher_suites;
    assert(openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32); /* sha256 */

    ptls_key_exchange_context_t *esni_private_keys[2] = {key_from_pem(ESNI_SECP256R1KEY), NULL};

    ctx = ctx_peer = &openssl_ctx;
    verify_certificate = &openssl_verify_certificate.super;
    ADD_FFX_AES128_ALGORITHMS(openssl);
#if PTLS_OPENSSL_HAVE_CHACHA20_POLY1305
    ADD_FFX_CHACHA20_ALGORITHMS(openssl);
#endif

    subtest("rsa-sign", test_rsa_sign);
    subtest("ecdsa-sign", test_ecdsa_sign);
    subtest("cert-verify", test_cert_verify);
    subtest("picotls", test_picotls);
    test_picotls_esni(esni_private_keys);

    ctx = ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx_sha256only;
    ctx_peer = &openssl_ctx;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
    ptls_iovec_t minicrypto_certificate = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(
        &minicrypto_sign_certificate, ptls_iovec_init(SECP256R1_PRIVATE_KEY, sizeof(SECP256R1_PRIVATE_KEY) - 1));
    ptls_context_t minicrypto_ctx = {ptls_minicrypto_random_bytes,
                                     &ptls_get_time,
                                     ptls_minicrypto_key_exchanges,
                                     ptls_minicrypto_cipher_suites,
                                     {&minicrypto_certificate, 1},
                                     NULL,
                                     NULL,
                                     NULL,
                                     &minicrypto_sign_certificate.super};
    ctx = &openssl_ctx;
    ctx_peer = &minicrypto_ctx;
    subtest("vs. minicrypto", test_picotls);

    ctx = &minicrypto_ctx;
    ctx_peer = &openssl_ctx;
    subtest("minicrypto vs.", test_picotls);

    esni_private_keys[0]->on_exchange(esni_private_keys, 1, NULL, ptls_iovec_init(NULL, 0));
    return done_testing();
}